

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_3a70a8::SpecialSubstitution::printLeft(SpecialSubstitution *this,OutputStream *S)

{
  char *pcVar1;
  char *pcVar2;
  StringView R;
  
  switch(*(undefined4 *)&(this->super_Node).field_0xc) {
  case 0:
    pcVar1 = "std::allocator";
    pcVar2 = "";
    break;
  case 1:
    pcVar1 = "std::basic_string";
    pcVar2 = "";
    break;
  case 2:
    pcVar1 = "std::string";
    pcVar2 = "";
    break;
  case 3:
    pcVar1 = "std::istream";
    pcVar2 = "";
    break;
  case 4:
    pcVar1 = "std::ostream";
    pcVar2 = "";
    break;
  case 5:
    pcVar1 = "std::iostream";
    pcVar2 = "";
    break;
  default:
    return;
  }
  R.Last = pcVar2;
  R.First = pcVar1;
  OutputStream::operator+=(S,R);
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    switch (SSK) {
    case SpecialSubKind::allocator:
      S += "std::allocator";
      break;
    case SpecialSubKind::basic_string:
      S += "std::basic_string";
      break;
    case SpecialSubKind::string:
      S += "std::string";
      break;
    case SpecialSubKind::istream:
      S += "std::istream";
      break;
    case SpecialSubKind::ostream:
      S += "std::ostream";
      break;
    case SpecialSubKind::iostream:
      S += "std::iostream";
      break;
    }
  }